

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O0

void __thiscall CGV::visit(CGV *this,ASTNode *node)

{
  bool bVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *this_00;
  reference ppAVar2;
  ASTNode **child;
  iterator __end1;
  iterator __begin1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *__range1;
  ASTNode *node_local;
  CGV *this_local;
  
  this_00 = AST::ASTNode::getChildren(node);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::begin
            ((iterator *)&__end1._M_node,this_00);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::end((iterator *)&child,this_00);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&child);
    if (!bVar1) break;
    ppAVar2 = std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator*
                        ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)
                         &__end1._M_node);
    (**(*ppAVar2)->_vptr_ASTNode)(*ppAVar2,this);
    std::_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**>::operator++
              ((_Deque_iterator<AST::ASTNode_*,_AST::ASTNode_*&,_AST::ASTNode_**> *)&__end1._M_node)
    ;
  }
  return;
}

Assistant:

void CGV::visit(AST::ASTNode *node) {
    for (auto &child : node->getChildren()) child->accept(*this);
}